

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

RealType __thiscall OpenMD::Snapshot::getSelfPotential(Snapshot *this)

{
  int i;
  long lVar1;
  double dVar2;
  
  if (this->hasSelfPotential == true) {
    return (this->frameData).selfPotential;
  }
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + (this->frameData).selfPotentials.data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  (this->frameData).selfPotential = dVar2;
  this->hasSelfPotential = true;
  this->hasPotentialEnergy = false;
  this->hasTotalEnergy = false;
  return dVar2;
}

Assistant:

RealType Snapshot::getSelfPotential() {
    if (!hasSelfPotential) {
      frameData.selfPotential = 0.0;
      for (int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        frameData.selfPotential += frameData.selfPotentials[i];
      }
      hasSelfPotential   = true;
      hasPotentialEnergy = false;
      hasTotalEnergy     = false;
    }
    return frameData.selfPotential;
  }